

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt_bitmask(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                            NameValueUnsigned *nvlist,long lval)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  NameValueUnsigned *local_a8;
  NameValueUnsigned *nv;
  unsigned_long rest;
  char preamble [80];
  CURLcode local_3c;
  _Bool skip;
  CURLcode ret;
  long lval_local;
  NameValueUnsigned *nvlist_local;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  local_3c = curl_easy_setopt(curl,tag,lval);
  if (((config->libcurl != (char *)0x0) && (lval != 0)) && (local_3c == CURLE_OK)) {
    curl_msnprintf(&rest,0x50,"curl_easy_setopt(hnd, %s, ",name);
    nv = (NameValueUnsigned *)lval;
    for (local_a8 = nvlist; local_a8->name != (char *)0x0; local_a8 = local_a8 + 1) {
      if ((local_a8->value & ((ulong)nv ^ 0xffffffffffffffff)) == 0) {
        nv = (NameValueUnsigned *)((local_a8->value ^ 0xffffffffffffffff) & (ulong)nv);
        pcVar3 = ");";
        if (nv != (NameValueUnsigned *)0x0) {
          pcVar3 = " |";
        }
        CVar1 = easysrc_addf(&easysrc_code,"%s(long)%s%s",&rest,local_a8->name,pcVar3);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        local_3c = CURLE_OK;
        if (nv == (NameValueUnsigned *)0x0) break;
        sVar2 = strlen((char *)&rest);
        curl_msnprintf(&rest,0x50,"%*s",sVar2,"");
      }
    }
    if (nv != (NameValueUnsigned *)0x0) {
      local_3c = easysrc_addf(&easysrc_code,"%s%luUL);",&rest,nv);
    }
  }
  return local_3c;
}

Assistant:

CURLcode tool_setopt_bitmask(CURL *curl, struct GlobalConfig *config,
                             const char *name, CURLoption tag,
                             const struct NameValueUnsigned *nvlist,
                             long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    char preamble[80];
    unsigned long rest = (unsigned long)lval;
    const struct NameValueUnsigned *nv = NULL;
    msnprintf(preamble, sizeof(preamble),
              "curl_easy_setopt(hnd, %s, ", name);
    for(nv = nvlist; nv->name; nv++) {
      if((nv->value & ~ rest) == 0) {
        /* all value flags contained in rest */
        rest &= ~ nv->value;    /* remove bits handled here */
        CODE3("%s(long)%s%s",
              preamble, nv->name, rest ? " |" : ");");
        if(!rest)
          break;                /* handled them all */
        /* replace with all spaces for continuation line */
        msnprintf(preamble, sizeof(preamble), "%*s", strlen(preamble), "");
      }
    }
    /* If any bits have no definition, output an explicit value.
     * This could happen if new bits are defined and used
     * but the NameValue list is not updated. */
    if(rest)
      CODE2("%s%luUL);", preamble, rest);
  }

 nomem:
  return ret;
}